

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber *
BigNumber::unsignedMax(BigNumber *__return_storage_ptr__,BigNumber *num1,BigNumber *num2)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  BigNumber *myBig;
  size_t index;
  
  uVar1 = num1->numOfDigits;
  myBig = num1;
  if ((uVar1 <= num2->numOfDigits) && (myBig = num2, num2->numOfDigits <= uVar1)) {
    uVar2 = (ulong)(uVar1 - 1);
    do {
      index = uVar2;
      iVar3 = operator[](num1,index);
      iVar4 = operator[](num2,index);
      if (index == 0) break;
      uVar2 = index - 1;
    } while (iVar3 == iVar4);
    iVar3 = operator[](num1,index);
    iVar4 = operator[](num2,index);
    myBig = num1;
    if (iVar3 < iVar4) {
      operator[](num1,index);
      operator[](num2,index);
      myBig = num2;
    }
  }
  BigNumber(__return_storage_ptr__,myBig);
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::unsignedMax(const BigNumber &num1, const BigNumber &num2) {
    if( num1.numOfDigits > num2.numOfDigits){
        return num1;
    }

    if( num1.numOfDigits < num2.numOfDigits){
        return num2;
    }

    size_t index = num1.numOfDigits - 1;
    while( (num1[index] == num2[index]) && (index > 0) ){
        --index;
    }
    if( num1[index] >= num2[index]){
        return num1;
    }
    if( num1[index] < num2[index]){
        return num2;
    }
}